

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O2

int duckdb_hll::sdsll2str(char *s,longlong value)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  ulong uVar6;
  
  iVar5 = (int)s;
  pbVar4 = (byte *)s;
  uVar6 = -value;
  if (0 < value) {
    uVar6 = value;
  }
  do {
    pbVar3 = pbVar4;
    *pbVar3 = (byte)(uVar6 % 10) | 0x30;
    pbVar4 = pbVar3 + 1;
    bVar2 = 9 < uVar6;
    uVar6 = uVar6 / 10;
  } while (bVar2);
  if (value < 0) {
    *pbVar4 = 0x2d;
    pbVar4 = pbVar3 + 2;
  }
  *pbVar4 = 0;
  pbVar3 = pbVar4;
  for (; pbVar3 = pbVar3 + -1, s < pbVar3; s = (char *)((byte *)s + 1)) {
    bVar1 = *s;
    *s = *pbVar3;
    *pbVar3 = bVar1;
  }
  return (int)pbVar4 - iVar5;
}

Assistant:

int sdsll2str(char *s, long long value) {
    char *p, aux;
    unsigned long long v;
    size_t l;

    /* Generate the string representation, this method produces
     * an reversed string. */
    v = (value < 0) ? -value : value;
    p = s;
    do {
        *p++ = '0'+(v%10);
        v /= 10;
    } while(v);
    if (value < 0) *p++ = '-';

    /* Compute length and add null term. */
    l = p-s;
    *p = '\0';

    /* Reverse the string. */
    p--;
    while(s < p) {
        aux = *s;
        *s = *p;
        *p = aux;
        s++;
        p--;
    }
    return l;
}